

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.hpp
# Opt level: O1

int __thiscall
cinatra::http_parser::parse_response(http_parser *this,char *data,size_t size,int last_len)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  int local_30;
  int minor_version;
  size_t msg_len;
  char *msg;
  
  this->num_headers_ = 100;
  pcVar5 = data + size;
  minor_version = -1;
  this->status_ = 0;
  iVar2 = 0;
  msg = (char *)0x0;
  msg_len = 0;
  this->num_headers_ = 0;
  if (last_len != 0) {
    pcVar3 = data + (long)last_len + -3;
    if ((uint)last_len < 3) {
      pcVar3 = data;
    }
    do {
      if (pcVar3 == pcVar5) {
LAB_00123804:
        local_30 = -2;
        iVar2 = local_30;
        goto LAB_00123810;
      }
      pcVar4 = pcVar3 + 1;
      if (*pcVar3 == '\n') {
LAB_001237b9:
        iVar1 = iVar2 + 1;
      }
      else {
        iVar1 = 0;
        if (*pcVar3 == '\r') {
          if (pcVar4 == pcVar5) goto LAB_00123804;
          if (*pcVar4 == '\n') {
            pcVar4 = pcVar3 + 2;
            goto LAB_001237b9;
          }
          local_30 = -1;
          iVar2 = local_30;
          goto LAB_00123810;
        }
      }
      iVar2 = iVar1;
      pcVar3 = pcVar4;
    } while (iVar2 != 2);
  }
  pcVar5 = detail::parse_response
                     (data,pcVar5,&minor_version,&this->status_,&msg,&msg_len,
                      (this->headers_)._M_elems,&this->num_headers_,100,&local_30);
  iVar2 = local_30;
  if (pcVar5 != (char *)0x0) {
    iVar2 = (int)pcVar5 - (int)data;
  }
LAB_00123810:
  this->header_len_ = iVar2;
  (this->msg_)._M_len = msg_len;
  (this->msg_)._M_str = msg;
  parse_body_len(this);
  if ((this->header_len_ < 0) && (this->num_headers_ == 100)) {
    output_error(this);
  }
  return this->header_len_;
}

Assistant:

int parse_response(const char *data, size_t size, int last_len) {
    int minor_version;

    num_headers_ = CINATRA_MAX_HTTP_HEADER_FIELD_SIZE;
    const char *msg;
    size_t msg_len;
    header_len_ = cinatra::detail::phr_parse_response(
        data, size, &minor_version, &status_, &msg, &msg_len, headers_.data(),
        &num_headers_, last_len);
    msg_ = {msg, msg_len};
    parse_body_len();
    if (header_len_ < 0) [[unlikely]] {
      CINATRA_LOG_WARNING << "parse http head failed";
      if (num_headers_ == CINATRA_MAX_HTTP_HEADER_FIELD_SIZE) {
        output_error();
      }
    }
    return header_len_;
  }